

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O3

void __thiscall Assimp::glTFExporter::ExportAnimations(glTFExporter *this)

{
  char *__s;
  size_type *psVar1;
  aiNodeAnim *paVar2;
  glTFExporter *pgVar3;
  aiScene *paVar4;
  undefined8 *puVar5;
  uint *puVar6;
  long *plVar7;
  long *plVar8;
  ulong uVar9;
  int iVar10;
  aiAnimation *paVar11;
  Ref<glTF::Animation> RVar12;
  Ref<glTF::Node> RVar13;
  string channelType;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string nameAnim;
  AnimSampler tmpAnimSampler;
  undefined1 *local_2f8;
  long local_2f0;
  undefined1 local_2e8;
  undefined7 uStack_2e7;
  aiNodeAnim *local_2d8;
  string local_2d0;
  aiAnimation *local_2b0;
  glTFExporter *local_2a8;
  undefined1 local_2a0 [48];
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  long *local_250 [2];
  long local_240 [2];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  Ref<glTF::Animation> local_210;
  long *local_200;
  char *local_1f8;
  long local_1f0 [2];
  ulong local_1e0;
  ulong local_1d8;
  uint *local_1d0;
  uint *local_1c8;
  uint *local_1c0;
  Ref<glTF::Buffer> local_1b8;
  undefined1 local_1a8 [96];
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [16];
  
  local_1b8.vector =
       &(((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        buffers).mObjs;
  local_1b8.index = 0;
  paVar4 = this->mScene;
  if (paVar4->mNumAnimations != 0) {
    local_1d8 = 0;
    local_2a8 = this;
    do {
      paVar11 = paVar4->mAnimations[local_1d8];
      local_200 = local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"anim","");
      local_2b0 = paVar11;
      if ((paVar11->mName).length != 0) {
        __s = (paVar11->mName).data;
        local_2d8 = (aiNodeAnim *)local_1f8;
        strlen(__s);
        paVar11 = local_2b0;
        std::__cxx11::string::_M_replace((ulong)&local_200,0,(char *)local_2d8,(ulong)__s);
      }
      if (paVar11->mNumChannels != 0) {
        uVar9 = 0;
        do {
          local_2d8 = paVar11->mChannels[uVar9];
          local_2a0._0_8_ = local_2a0 + 0x10;
          local_1e0 = uVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2a0,local_200,local_1f8 + (long)local_200);
          std::__cxx11::string::append((char *)local_2a0);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)local_138[0]._M_local_buf);
          uVar9 = 0xf;
          if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
            uVar9 = CONCAT71(local_2a0._17_7_,local_2a0[0x10]);
          }
          if (uVar9 < (ulong)(local_2f0 + local_2a0._8_8_)) {
            uVar9 = 0xf;
            if (local_2f8 != &local_2e8) {
              uVar9 = CONCAT71(uStack_2e7,local_2e8);
            }
            if (uVar9 < (ulong)(local_2f0 + local_2a0._8_8_)) goto LAB_00353f17;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,local_2a0._0_8_);
          }
          else {
LAB_00353f17:
            puVar5 = (undefined8 *)std::__cxx11::string::_M_append(local_2a0,(ulong)local_2f8);
          }
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          psVar1 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_2d0.field_2._M_allocated_capacity = *psVar1;
            local_2d0.field_2._8_8_ = puVar5[3];
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *psVar1;
            local_2d0._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_2d0._M_string_length = puVar5[1];
          *puVar5 = psVar1;
          puVar5[1] = 0;
          *(undefined1 *)psVar1 = 0;
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8,CONCAT71(uStack_2e7,local_2e8) + 1);
          }
          if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
            operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
          }
          glTF::Asset::FindUniqueID
                    ((string *)local_1a8,
                     (local_2a8->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_2d0,"animation");
          std::__cxx11::string::operator=((string *)&local_2d0,(string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          }
          pgVar3 = local_2a8;
          RVar12 = glTF::LazyDict<glTF::Animation>::Create
                             (&((local_2a8->mAsset).
                                super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->animations,local_2d0._M_dataplus._M_p);
          paVar2 = local_2d8;
          local_210.vector = RVar12.vector;
          local_210.index = RVar12.index;
          ExtractAnimationData
                    ((pgVar3->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&local_2d0,&local_210,&local_1b8,local_2d8,
                     (float)local_2b0->mTicksPerSecond);
          local_1c0 = &paVar2->mNumPositionKeys;
          local_1c8 = &paVar2->mNumScalingKeys;
          local_1d0 = &paVar2->mNumRotationKeys;
          local_2d8 = (aiNodeAnim *)(paVar2->mNodeName).data;
          iVar10 = 0;
          do {
            local_2f8 = &local_2e8;
            local_2f0 = 0;
            local_2e8 = 0;
            if (iVar10 == 2) {
              std::__cxx11::string::_M_replace((ulong)&local_2f8,0,(char *)0x0,0x684a08);
              puVar6 = local_1c0;
            }
            else if (iVar10 == 1) {
              std::__cxx11::string::_M_replace((ulong)&local_2f8,0,(char *)0x0,0x67a4f8);
              puVar6 = local_1c8;
            }
            else {
              std::__cxx11::string::_M_replace((ulong)&local_2f8,0,(char *)0x0,0x6959ac);
              puVar6 = local_1d0;
            }
            if (0 < (int)*puVar6) {
              local_2a0._0_8_ = local_2a0 + 0x10;
              local_2a0._8_8_ = 0;
              local_2a0[0x10] = '\0';
              local_2a0._32_8_ = (vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)0x0;
              local_2a0._40_4_ = 0;
              local_270._M_p = (pointer)&local_260;
              local_268 = 0;
              local_260._M_local_buf[0] = '\0';
              local_1a8._0_8_ = local_1a8 + 0x10;
              local_1a8._8_8_ = 0;
              local_1a8[0x10] = '\0';
              local_1a8._32_8_ = local_1a8 + 0x30;
              local_1a8._40_8_ = (char *)0x0;
              local_1a8[0x30] = '\0';
              local_1a8._64_8_ = local_1a8 + 0x50;
              local_1a8._72_8_ = (char *)0x0;
              local_1a8[0x50] = '\0';
              local_148._M_p = (pointer)local_138;
              local_140 = 0;
              local_138[0]._M_local_buf[0] = '\0';
              local_250[0] = local_240;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_250,local_2d0._M_dataplus._M_p,
                         local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
              std::__cxx11::string::append((char *)local_250);
              plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_250,(ulong)local_2f8);
              plVar8 = plVar7 + 2;
              if ((long *)*plVar7 == plVar8) {
                local_220 = *plVar8;
                lStack_218 = plVar7[3];
                local_230 = &local_220;
              }
              else {
                local_220 = *plVar8;
                local_230 = (long *)*plVar7;
              }
              local_228 = plVar7[1];
              *plVar7 = (long)plVar8;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::operator=((string *)local_2a0,(string *)&local_230);
              if (local_230 != &local_220) {
                operator_delete(local_230,local_220 + 1);
              }
              if (local_250[0] != local_240) {
                operator_delete(local_250[0],local_240[0] + 1);
              }
              std::__cxx11::string::_M_assign((string *)&local_270);
              std::__cxx11::string::_M_assign((string *)&local_148);
              local_250[0] = local_240;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_250,local_2d0._M_dataplus._M_p,
                         local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
              std::__cxx11::string::append((char *)local_250);
              plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_250,(ulong)local_2f8);
              plVar8 = plVar7 + 2;
              if ((long *)*plVar7 == plVar8) {
                local_220 = *plVar8;
                lStack_218 = plVar7[3];
                local_230 = &local_220;
              }
              else {
                local_220 = *plVar8;
                local_230 = (long *)*plVar7;
              }
              local_228 = plVar7[1];
              *plVar7 = (long)plVar8;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_230);
              if (local_230 != &local_220) {
                operator_delete(local_230,local_220 + 1);
              }
              if (local_250[0] != local_240) {
                operator_delete(local_250[0],local_240[0] + 1);
              }
              RVar13 = glTF::LazyDict<glTF::Node>::Get
                                 (&((local_2a8->mAsset).
                                    super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->nodes,(char *)local_2d8);
              local_2a0._32_8_ = RVar13.vector;
              local_2a0._40_4_ = RVar13.index;
              std::__cxx11::string::_M_replace
                        ((ulong)(local_1a8 + 0x20),0,(char *)local_1a8._40_8_,0x67a0ef);
              std::__cxx11::string::_M_replace
                        ((ulong)(local_1a8 + 0x40),0,(char *)local_1a8._72_8_,0x68254e);
              std::
              vector<glTF::Animation::AnimChannel,_std::allocator<glTF::Animation::AnimChannel>_>::
              push_back(&((local_210.vector)->
                         super__Vector_base<glTF::Animation_*,_std::allocator<glTF::Animation_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[local_210.index]->Channels,
                        (value_type *)local_2a0);
              std::
              vector<glTF::Animation::AnimSampler,_std::allocator<glTF::Animation::AnimSampler>_>::
              push_back(&((local_210.vector)->
                         super__Vector_base<glTF::Animation_*,_std::allocator<glTF::Animation_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[local_210.index]->Samplers,
                        (value_type *)local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_p != local_138) {
                operator_delete(local_148._M_p,
                                CONCAT71(local_138[0]._M_allocated_capacity._1_7_,
                                         local_138[0]._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_1a8._64_8_ != local_1a8 + 0x50) {
                operator_delete((void *)local_1a8._64_8_,
                                CONCAT71(local_1a8._81_7_,local_1a8[0x50]) + 1);
              }
              if ((undefined1 *)local_1a8._32_8_ != local_1a8 + 0x30) {
                operator_delete((void *)local_1a8._32_8_,
                                CONCAT71(local_1a8._49_7_,local_1a8[0x30]) + 1);
              }
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,
                                CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_p != &local_260) {
                operator_delete(local_270._M_p,
                                CONCAT71(local_260._M_allocated_capacity._1_7_,
                                         local_260._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
                operator_delete((void *)local_2a0._0_8_,
                                CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
              }
            }
            if (local_2f8 != &local_2e8) {
              operator_delete(local_2f8,CONCAT71(uStack_2e7,local_2e8) + 1);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != 3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          uVar9 = local_1e0 + 1;
          paVar11 = local_2b0;
        } while (uVar9 < local_2b0->mNumChannels);
      }
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
      }
      local_1d8 = local_1d8 + 1;
      paVar4 = local_2a8->mScene;
    } while (local_1d8 < paVar4->mNumAnimations);
  }
  return;
}

Assistant:

void glTFExporter::ExportAnimations()
{
    Ref<Buffer> bufferRef = mAsset->buffers.Get(unsigned (0));

    for (unsigned int i = 0; i < mScene->mNumAnimations; ++i) {
        const aiAnimation* anim = mScene->mAnimations[i];

        std::string nameAnim = "anim";
        if (anim->mName.length > 0) {
            nameAnim = anim->mName.C_Str();
        }

        for (unsigned int channelIndex = 0; channelIndex < anim->mNumChannels; ++channelIndex) {
            const aiNodeAnim* nodeChannel = anim->mChannels[channelIndex];

            // It appears that assimp stores this type of animation as multiple animations.
            // where each aiNodeAnim in mChannels animates a specific node.
            std::string name = nameAnim + "_" + to_string(channelIndex);
            name = mAsset->FindUniqueID(name, "animation");
            Ref<Animation> animRef = mAsset->animations.Create(name);

            /******************* Parameters ********************/
            ExtractAnimationData(*mAsset, name, animRef, bufferRef, nodeChannel, static_cast<float>(anim->mTicksPerSecond));

            for (unsigned int j = 0; j < 3; ++j) {
                std::string channelType;
                int channelSize;
                switch (j) {
                    case 0:
                        channelType = "rotation";
                        channelSize = nodeChannel->mNumRotationKeys;
                        break;
                    case 1:
                        channelType = "scale";
                        channelSize = nodeChannel->mNumScalingKeys;
                        break;
                    case 2:
                        channelType = "translation";
                        channelSize = nodeChannel->mNumPositionKeys;
                        break;
                }

                if (channelSize < 1) { continue; }

                Animation::AnimChannel tmpAnimChannel;
                Animation::AnimSampler tmpAnimSampler;

                tmpAnimChannel.sampler = name + "_" + channelType;
                tmpAnimChannel.target.path = channelType;
                tmpAnimSampler.output = channelType;
                tmpAnimSampler.id = name + "_" + channelType;

                tmpAnimChannel.target.id = mAsset->nodes.Get(nodeChannel->mNodeName.C_Str());

                tmpAnimSampler.input = "TIME";
                tmpAnimSampler.interpolation = "LINEAR";

                animRef->Channels.push_back(tmpAnimChannel);
                animRef->Samplers.push_back(tmpAnimSampler);
            }

        }

        // Assimp documentation staes this is not used (not implemented)
        // for (unsigned int channelIndex = 0; channelIndex < anim->mNumMeshChannels; ++channelIndex) {
        //     const aiMeshAnim* meshChannel = anim->mMeshChannels[channelIndex];
        // }

    } // End: for-loop mNumAnimations
}